

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.cpp
# Opt level: O2

int __thiscall mpt::buffer::copy(buffer *this,EVP_PKEY_CTX *dst,EVP_PKEY_CTX *src)

{
  long lVar1;
  int iVar2;
  undefined8 unaff_RBX;
  size_t len;
  
  iVar2 = (int)CONCAT71((int7)((ulong)unaff_RBX >> 8),1);
  if ((buffer *)dst != this) {
    lVar1 = mpt_buffer_set(this,*(undefined8 *)(dst + 8),0,dst + 0x20,*(undefined8 *)(dst + 0x18));
    if (lVar1 < 0) {
      iVar2 = 0;
    }
    else {
      len = this->_used - *(ulong *)(dst + 0x18);
      if (*(ulong *)(dst + 0x18) <= this->_used && len != 0) {
        trim(this,len);
      }
    }
  }
  return iVar2;
}

Assistant:

bool buffer::copy(const buffer &from)
{
	if (&from == this) {
		return true;
	}
	if (mpt_buffer_set(this, from._content_traits, 0, &from + 1, from._used) < 0) {
		return false;
	}
	if (from._used < _used) {
		trim(_used - from._used);
	}
	return true;
}